

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O0

span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> * __thiscall
pstore::gsl::details::
span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_-1L>,_false>::operator--
          (span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> *this
          )

{
  long lVar1;
  index_type iVar2;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> *this_local;
  
  if ((this->span_ != (span<pstore::index::details::index_pointer,__1L> *)0x0) && (0 < this->index_)
     ) {
    lVar1 = this->index_;
    iVar2 = span<pstore::index::details::index_pointer,_-1L>::length(this->span_);
    if (lVar1 <= iVar2) {
      this->index_ = this->index_ + -1;
      return this;
    }
  }
  assert_failed("span_ && index_ > 0 && index_ <= span_->length ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x85);
}

Assistant:

span_iterator & operator-- () noexcept {
                    PSTORE_ASSERT (span_ && index_ > 0 && index_ <= span_->length ());
                    --index_;
                    return *this;
                }